

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

lysc_node *
lysc_ext_find_node(lysc_ext_instance *ext,lys_module *module,char *name,size_t name_len,
                  uint16_t nodetype,uint32_t options)

{
  int iVar1;
  lysc_node *local_40;
  lysc_node *node;
  uint32_t options_local;
  uint16_t nodetype_local;
  size_t name_len_local;
  char *name_local;
  lys_module *module_local;
  lysc_ext_instance *ext_local;
  
  local_40 = (lysc_node *)0x0;
  if (ext == (lysc_ext_instance *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ext","lysc_ext_find_node"
          );
    ext_local = (lysc_ext_instance *)0x0;
  }
  else if (name == (char *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","name",
           "lysc_ext_find_node");
    ext_local = (lysc_ext_instance *)0x0;
  }
  else {
    node._6_2_ = nodetype;
    if (nodetype == 0) {
      node._6_2_ = 0xffff;
    }
    if ((module == (lys_module *)0x0) || (module == ext->module)) {
      do {
        while( true ) {
          do {
            local_40 = lys_getnext_ext(local_40,(lysc_node *)0x0,ext,options);
            if (local_40 == (lysc_node *)0x0) {
              return (lysc_node *)0x0;
            }
          } while ((local_40->nodetype & node._6_2_) == 0);
          if (name_len == 0) break;
          iVar1 = ly_strncmp(local_40->name,name,name_len);
          if (iVar1 == 0) {
            return local_40;
          }
        }
        iVar1 = strcmp(local_40->name,name);
        ext_local = (lysc_ext_instance *)local_40;
      } while (iVar1 != 0);
    }
    else {
      ext_local = (lysc_ext_instance *)0x0;
    }
  }
  return (lysc_node *)ext_local;
}

Assistant:

const struct lysc_node *
lysc_ext_find_node(const struct lysc_ext_instance *ext, const struct lys_module *module, const char *name, size_t name_len,
        uint16_t nodetype, uint32_t options)
{
    const struct lysc_node *node = NULL;

    LY_CHECK_ARG_RET(NULL, ext, name, NULL);
    if (!nodetype) {
        nodetype = LYS_NODETYPE_MASK;
    }

    if (module && (module != ext->module)) {
        return NULL;
    }

    while ((node = lys_getnext_ext(node, NULL, ext, options))) {
        if (!(node->nodetype & nodetype)) {
            continue;
        }

        if (name_len) {
            if (!ly_strncmp(node->name, name, name_len)) {
                return node;
            }
        } else {
            if (!strcmp(node->name, name)) {
                return node;
            }
        }
    }
    return NULL;
}